

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

bool __thiscall roaring::Roaring64Map::operator==(Roaring64Map *this,Roaring64Map *r)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  _Bool _Var3;
  bool bVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  _Rb_tree_header *p_Var8;
  
  p_Var5 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (r->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = &(r->roarings)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var7 && (_Rb_tree_header *)p_Var5 != p_Var8) {
    do {
      _Var1 = p_Var5[1]._M_color;
      _Var2 = p_Var6[1]._M_color;
      _Var3 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var5[1]._M_parent);
      if (_Var3) {
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
LAB_001099b1:
        bVar4 = false;
      }
      else {
        _Var3 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var6[1]._M_parent);
        if (_Var3) {
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          goto LAB_001099b1;
        }
        if (_Var1 == _Var2) {
          _Var3 = roaring_bitmap_equals
                            ((roaring_bitmap_t *)&p_Var5[1]._M_parent,
                             (roaring_bitmap_t *)&p_Var6[1]._M_parent);
          bVar4 = true;
          if (_Var3) {
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
            bVar4 = false;
          }
        }
        else {
          bVar4 = true;
        }
      }
      if (bVar4) {
        return false;
      }
    } while (((_Rb_tree_header *)p_Var5 != p_Var8) && ((_Rb_tree_header *)p_Var6 != p_Var7));
  }
  while( true ) {
    if ((_Rb_tree_header *)p_Var5 == p_Var8) {
      if ((_Rb_tree_header *)p_Var6 == p_Var7) {
        _Var3 = true;
      }
      else {
        do {
          _Var3 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var6[1]._M_parent);
          if (!_Var3) {
            return _Var3;
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        } while ((_Rb_tree_header *)p_Var6 != p_Var7);
      }
      return _Var3;
    }
    _Var3 = roaring_bitmap_is_empty((roaring_bitmap_t *)&p_Var5[1]._M_parent);
    if (!_Var3) break;
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
  }
  return false;
}

Assistant:

bool runOptimize() {
        return std::accumulate(
            roarings.begin(), roarings.end(), true,
            [](bool previous, std::pair<const uint32_t, Roaring> &map_entry) {
                return map_entry.second.runOptimize() && previous;
            });
    }